

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

MaybeResult<wasm::IRBuilder::HoistedVal> * __thiscall
wasm::IRBuilder::hoistLastValue
          (MaybeResult<wasm::IRBuilder::HoistedVal> *__return_storage_ptr__,IRBuilder *this)

{
  pointer ppEVar1;
  pointer ppEVar2;
  Type type;
  ScopeCtx *pSVar3;
  Expression *expr;
  LocalSet *pLVar4;
  LocalGet *expr_00;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  string local_b0 [32];
  undefined1 local_90 [8];
  Result<unsigned_int> scratchIdx;
  Result<unsigned_int> _val;
  
  pSVar3 = getScope(this);
  ppEVar1 = (pSVar3->exprStack).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar2 = (pSVar3->exprStack).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar5 = (long)ppEVar2 - (long)ppEVar1 >> 3;
  uVar6 = uVar5 & 0xffffffff;
  uVar8 = uVar5 & 0xffffffff;
  do {
    uVar6 = uVar6 - 1;
    uVar7 = (int)uVar8 - 1;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 0) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> +
       0x20) = '\x01';
      return __return_storage_ptr__;
    }
    uVar9 = (ulong)((uint)uVar6 & 0x7fffffff);
    type.id = (ppEVar1[uVar9]->type).id;
  } while (type.id == 0);
  if (uVar5 - 1 != uVar9) {
    if (type.id != 1) {
      addScratchLocal((Result<unsigned_int> *)local_90,this,type);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)
                 ((long)&scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
                 (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_90);
      if (_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  (local_b0,(string *)
                            ((long)&scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                    super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                    super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                    super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        std::__detail::__variant::
        _Variant_storage<false,wasm::IRBuilder::HoistedVal,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::IRBuilder::HoistedVal,wasm::None,wasm::Err> *)
                   __return_storage_ptr__,local_b0);
        std::__cxx11::string::~string(local_b0);
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                          ((long)&scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                          ((long)&scratchIdx.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        pLVar4 = Builder::makeLocalSet(&this->builder,local_90._0_4_,ppEVar1[uVar9]);
        ppEVar1[uVar9] = (Expression *)pLVar4;
        expr_00 = Builder::makeLocalGet(&this->builder,local_90._0_4_,type);
        push(this,(Expression *)expr_00);
        *(uint *)&(__return_storage_ptr__->val).
                  super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> =
             uVar7;
        *(LocalGet **)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> +
         8) = expr_00;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> +
         0x20) = '\0';
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_90);
      return __return_storage_ptr__;
    }
    if ((ppEVar2[-1]->type).id != 1) {
      expr = (Expression *)Builder::makeUnreachable(&this->builder);
      push(this,expr);
    }
  }
  *(uint *)&(__return_storage_ptr__->val).
            super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> = uVar7
  ;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> + 8) = 0
  ;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::IRBuilder::HoistedVal,_wasm::None,_wasm::Err> + 0x20)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<IRBuilder::HoistedVal> IRBuilder::hoistLastValue() {
  auto& stack = getScope().exprStack;
  int index = stack.size() - 1;
  for (; index >= 0; --index) {
    if (stack[index]->type != Type::none) {
      break;
    }
  }
  if (index < 0) {
    // There is no value-producing or unreachable expression.
    return {};
  }
  if (unsigned(index) == stack.size() - 1) {
    // Value-producing expression already on top of the stack.
    return HoistedVal{Index(index), nullptr};
  }
  auto*& expr = stack[index];
  auto type = expr->type;
  if (type == Type::unreachable) {
    // Make sure the top of the stack also has an unreachable expression.
    if (stack.back()->type != Type::unreachable) {
      push(builder.makeUnreachable());
    }
    return HoistedVal{Index(index), nullptr};
  }
  // Hoist with a scratch local.
  auto scratchIdx = addScratchLocal(type);
  CHECK_ERR(scratchIdx);
  expr = builder.makeLocalSet(*scratchIdx, expr);
  auto* get = builder.makeLocalGet(*scratchIdx, type);
  push(get);
  return HoistedVal{Index(index), get};
}